

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

void BenchTopKSubset<4u>(string *PATH)

{
  Abstract<4U> *this;
  bool bVar1;
  undefined1 auVar2 [32];
  char cVar3;
  __node_base_ptr p_Var4;
  pointer ppbVar5;
  undefined1 auVar6 [64];
  int iVar7;
  value_type *__val;
  ostream *poVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  WavingSketch<8U,_1U,_4U> *this_00;
  SS<4U> *this_01;
  USS<4U> *this_02;
  Count_Heap<4U> *this_03;
  LdSketchWrapper<4U> *this_04;
  ofstream *poVar11;
  long *plVar12;
  undefined8 *puVar13;
  _Hash_node_base *p_Var14;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var15;
  ulong uVar16;
  uint32_t _SIZE;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  __node_base_ptr p_Var17;
  uint uVar18;
  ulong uVar19;
  uint32_t i;
  basic_ostream<char,_std::char_traits<char>_> **out;
  long lVar20;
  Data<4U> *pDVar21;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  *__node_gen;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  count_type cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  HashMap<4U> mp;
  Abstract<4U> *sketches [5] [5];
  int local_25c;
  long *local_258 [2];
  long local_248 [2];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  local_238;
  undefined8 local_230;
  undefined1 local_228 [32];
  _Hash_node_base local_208;
  size_t sStack_200;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_1f8;
  int local_1dc;
  long local_1d8;
  Data<4U> *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  float local_180;
  undefined4 uStack_17c;
  undefined1 auStack_178 [16];
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_130;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  local_f8 [4];
  long alStack_d8 [21];
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchTopKSubset\n\x1b[0m");
  local_25c = 0;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"caida","");
  local_1d0 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&local_25c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total ",6);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_25c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," items",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_1a0._0_8_ = auStack_178 + 8;
  local_1a0._8_8_ = 1;
  local_190 = (undefined1  [16])0x0;
  local_180 = 1.0;
  auStack_178 = (undefined1  [16])0x0;
  if (local_25c < 1) {
    local_190._8_8_ = 0;
  }
  else {
    lVar22 = 0;
    pDVar21 = local_1d0;
    do {
      iVar9 = std::
              _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_1a0,pDVar21);
      if (iVar9.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        pmVar10 = std::__detail::
                  _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_1a0,pDVar21);
        *pmVar10 = 1;
      }
      else {
        pmVar10 = std::__detail::
                  _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_1a0,pDVar21);
        *pmVar10 = *pmVar10 + 1;
      }
      lVar22 = lVar22 + 1;
      pDVar21 = pDVar21 + 1;
    } while (lVar22 < local_25c);
  }
  local_f8[0]._M_h = (__hashtable_alloc *)&local_130;
  local_130._M_buckets = (__buckets_ptr)0x0;
  local_130._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_130._M_rehash_policy._4_4_ = uStack_17c;
  local_130._M_rehash_policy._M_max_load_factor = local_180;
  local_130._M_rehash_policy._M_next_resize = auStack_178._0_8_;
  local_130._M_single_bucket = (__node_base_ptr)0x0;
  __node_gen = local_f8;
  local_130._M_bucket_count = local_1a0._8_8_;
  local_130._M_element_count = local_190._8_8_;
  std::
  _Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<4u>const,int>,true>>>>
            ((_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_f8[0]._M_h,
             (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)local_1a0,__node_gen);
  local_1dc = Get_TopK<4u>((HashMap<4U> *)&local_130,2000);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_130);
  lVar22 = 0x20;
  _SIZE = 500;
  uVar18 = 30000;
  do {
    this_00 = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
    WavingSketch<8U,_1U,_4U>::WavingSketch(this_00,(uVar18 + 20000) / 0x42);
    *(WavingSketch<8U,_1U,_4U> **)((long)&local_f8[-4]._M_h + lVar22) = this_00;
    this_01 = (SS<4U> *)operator_new(0x78);
    SS<4U>::SS(this_01,_SIZE);
    *(SS<4U> **)((long)&local_f8[-3]._M_h + lVar22) = this_01;
    this_02 = (USS<4U> *)operator_new(0x78);
    USS<4U>::USS(this_02,_SIZE);
    *(USS<4U> **)((long)&local_f8[-2]._M_h + lVar22) = this_02;
    this_03 = (Count_Heap<4U> *)operator_new(0x88);
    Count_Heap<4U>::Count_Heap(this_03,0x9c4,uVar18 / 0xc,3);
    *(Count_Heap<4U> **)((long)&local_f8[-1]._M_h + lVar22) = this_03;
    this_04 = (LdSketchWrapper<4U> *)operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper(this_04,uVar18 + 20000,local_1dc);
    *(LdSketchWrapper<4U> **)((long)&local_f8[0]._M_h + lVar22) = this_04;
    lVar22 = lVar22 + 0x28;
    _SIZE = _SIZE + 500;
    uVar18 = uVar18 + 50000;
  } while (lVar22 != 0xe8);
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((__node_base_ptr)
                 local_1f8.
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4);
  ((__node_base_ptr)
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start)->_M_nxt = (_Hash_node_base *)0x0;
  ((__node_base_ptr)
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start)[1]._M_nxt = (_Hash_node_base *)0x0;
  ((__node_base_ptr)
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start)[2]._M_nxt = (_Hash_node_base *)0x0;
  ((__node_base_ptr)
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start)[3]._M_nxt = (_Hash_node_base *)0x0;
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1f8.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  poVar11 = (ofstream *)operator_new(0x200);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_258);
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)local_258,(ulong)local_1c8[0]);
  p_Var14 = (_Hash_node_base *)(plVar12 + 2);
  if ((_Hash_node_base *)*plVar12 == p_Var14) {
    local_208._M_nxt = p_Var14->_M_nxt;
    sStack_200 = plVar12[3];
    local_228._16_8_ = &local_208;
  }
  else {
    local_208._M_nxt = p_Var14->_M_nxt;
    local_228._16_8_ = (_Hash_node_base *)*plVar12;
  }
  local_228._24_8_ = plVar12[1];
  *plVar12 = (long)p_Var14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_228 + 0x10);
  p_Var15 = (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(puVar13 + 2);
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)*puVar13 == p_Var15) {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_228._8_8_ = puVar13[3];
    local_238._M_h = (__hashtable_alloc *)local_228;
  }
  else {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_238._M_h = (__hashtable_alloc *)*puVar13;
  }
  local_230 = puVar13[1];
  *puVar13 = p_Var15;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  std::ofstream::ofstream(poVar11,(string *)&local_238,_S_out);
  *(_Hash_node_base **)
   local_1f8.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start = (_Hash_node_base *)poVar11;
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_238._M_h !=
      (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_228) {
    operator_delete(local_238._M_h,local_228._0_8_ + 1);
  }
  if ((_Hash_node_base *)local_228._16_8_ != &local_208) {
    operator_delete((void *)local_228._16_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  poVar11 = (ofstream *)operator_new(0x200);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_258);
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)local_258,(ulong)local_1c8[0]);
  p_Var14 = (_Hash_node_base *)(plVar12 + 2);
  if ((_Hash_node_base *)*plVar12 == p_Var14) {
    local_208._M_nxt = p_Var14->_M_nxt;
    sStack_200 = plVar12[3];
    local_228._16_8_ = &local_208;
  }
  else {
    local_208._M_nxt = p_Var14->_M_nxt;
    local_228._16_8_ = (_Hash_node_base *)*plVar12;
  }
  local_228._24_8_ = plVar12[1];
  *plVar12 = (long)p_Var14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_228 + 0x10);
  p_Var15 = (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(puVar13 + 2);
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)*puVar13 == p_Var15) {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_228._8_8_ = puVar13[3];
    local_238._M_h = (__hashtable_alloc *)local_228;
  }
  else {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_238._M_h = (__hashtable_alloc *)*puVar13;
  }
  local_230 = puVar13[1];
  *puVar13 = p_Var15;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  std::ofstream::ofstream(poVar11,(string *)&local_238,_S_out);
  ((__node_base_ptr)
  (local_1f8.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start + 1))->_M_nxt = (_Hash_node_base *)poVar11;
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_238._M_h !=
      (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_228) {
    operator_delete(local_238._M_h,local_228._0_8_ + 1);
  }
  if ((_Hash_node_base *)local_228._16_8_ != &local_208) {
    operator_delete((void *)local_228._16_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  poVar11 = (ofstream *)operator_new(0x200);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_258);
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)local_258,(ulong)local_1c8[0]);
  p_Var14 = (_Hash_node_base *)(plVar12 + 2);
  if ((_Hash_node_base *)*plVar12 == p_Var14) {
    local_208._M_nxt = p_Var14->_M_nxt;
    sStack_200 = plVar12[3];
    local_228._16_8_ = &local_208;
  }
  else {
    local_208._M_nxt = p_Var14->_M_nxt;
    local_228._16_8_ = (_Hash_node_base *)*plVar12;
  }
  local_228._24_8_ = plVar12[1];
  *plVar12 = (long)p_Var14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_228 + 0x10);
  p_Var15 = (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(puVar13 + 2);
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)*puVar13 == p_Var15) {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_228._8_8_ = puVar13[3];
    local_238._M_h = (__hashtable_alloc *)local_228;
  }
  else {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_238._M_h = (__hashtable_alloc *)*puVar13;
  }
  local_230 = puVar13[1];
  *puVar13 = p_Var15;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  std::ofstream::ofstream(poVar11,(string *)&local_238,_S_out);
  ((__node_base_ptr)
  (local_1f8.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start + 2))->_M_nxt = (_Hash_node_base *)poVar11;
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_238._M_h !=
      (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_228) {
    operator_delete(local_238._M_h,local_228._0_8_ + 1);
  }
  if ((_Hash_node_base *)local_228._16_8_ != &local_208) {
    operator_delete((void *)local_228._16_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  poVar11 = (ofstream *)operator_new(0x200);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_258);
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)local_258,(ulong)local_1c8[0]);
  p_Var14 = (_Hash_node_base *)(plVar12 + 2);
  if ((_Hash_node_base *)*plVar12 == p_Var14) {
    local_208._M_nxt = p_Var14->_M_nxt;
    sStack_200 = plVar12[3];
    local_228._16_8_ = &local_208;
  }
  else {
    local_208._M_nxt = p_Var14->_M_nxt;
    local_228._16_8_ = (_Hash_node_base *)*plVar12;
  }
  local_228._24_8_ = plVar12[1];
  *plVar12 = (long)p_Var14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_228 + 0x10);
  p_Var15 = (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(puVar13 + 2);
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)*puVar13 == p_Var15) {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_228._8_8_ = puVar13[3];
    local_238._M_h = (__hashtable_alloc *)local_228;
  }
  else {
    local_228._0_8_ = p_Var15->_M_buckets;
    local_238._M_h = (__hashtable_alloc *)*puVar13;
  }
  local_230 = puVar13[1];
  *puVar13 = p_Var15;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  std::ofstream::ofstream(poVar11,(string *)&local_238,_S_out);
  ((__node_base_ptr)
  (local_1f8.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start + 3))->_M_nxt = (_Hash_node_base *)poVar11;
  if ((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_238._M_h !=
      (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_228) {
    operator_delete(local_238._M_h,local_228._0_8_ + 1);
  }
  if ((_Hash_node_base *)local_228._16_8_ != &local_208) {
    operator_delete((void *)local_228._16_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
  }
  p_Var17 = (__node_base_ptr)
            local_1f8.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (__node_base_ptr)
           local_1f8.
           super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
    p_Var17 = (__node_base_ptr)
              local_1f8.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var4 = (__node_base_ptr)
             local_1f8.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppbVar5 = local_1f8.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      p_Var17 !=
      (__node_base_ptr)
      local_1f8.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; p_Var17 = p_Var17 + 1) {
    poVar8 = (ostream *)p_Var17->_M_nxt;
    local_1f8.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"MEM(KB)",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
    lVar22 = 0;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)p_Var17->_M_nxt,*(char **)(local_f8[lVar22]._M_h + 8),
                          *(long *)(local_f8[lVar22]._M_h + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 5);
    cVar3 = (char)p_Var17->_M_nxt;
    std::ios::widen((char)p_Var17->_M_nxt->_M_nxt[-3]._M_nxt + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    p_Var4 = (__node_base_ptr)
             local_1f8.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppbVar5;
  }
  local_1a8 = 0;
  local_1f8.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
  do {
    uVar18 = (int)(local_1a8 + 1) * 0x32;
    local_1d8 = local_1a8;
    local_1a8 = local_1a8 + 1;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar18);
    ppbVar5 = local_1f8.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var17 = (__node_base_ptr)
                   local_1f8.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; p_Var17 != (__node_base_ptr)ppbVar5;
        p_Var17 = p_Var17 + 1) {
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)p_Var17->_M_nxt,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
    }
    local_1d8 = alStack_d8[local_1d8 * 5];
    plVar12 = *(long **)(local_1d8 + 0x70);
    iVar7 = *(int *)((long)plVar12 + 0xc) * (int)plVar12[1];
    if (0 < iVar7) {
      uVar16 = (ulong)(iVar7 + 3U & 0xfffffffc);
      auVar28 = vpbroadcastq_avx512vl();
      uVar19 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar6 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar30 = auVar6;
        auVar29 = vpbroadcastq_avx512vl();
        auVar29 = vpor_avx2(auVar29,auVar2);
        uVar23 = vpcmpuq_avx512vl(auVar29,auVar28,2);
        uVar23 = uVar23 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(*plVar12 + uVar19 * 8));
        auVar24 = vpgatherqd_avx512vl(*(undefined8 *)(uVar16 + 0x40));
        auVar25._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar24._4_4_;
        auVar25._0_4_ = (uint)((byte)uVar23 & 1) * auVar24._0_4_;
        auVar25._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar24._8_4_;
        auVar25._12_4_ = (uint)(byte)(uVar23 >> 3) * auVar24._12_4_;
        auVar25 = vpaddd_avx(auVar25,auVar30._0_16_);
        uVar19 = uVar19 + 4;
        auVar6 = ZEXT1664(auVar25);
      } while (uVar16 != uVar19);
      auVar25 = vmovdqa32_avx512vl(auVar25);
      bVar1 = (bool)((byte)uVar23 & 1);
      auVar24._0_4_ = (uint)bVar1 * auVar25._0_4_ | (uint)!bVar1 * auVar30._0_4_;
      bVar1 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar1 * auVar25._4_4_ | (uint)!bVar1 * auVar30._4_4_;
      bVar1 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar1 * auVar25._8_4_ | (uint)!bVar1 * auVar30._8_4_;
      bVar1 = SUB81(uVar23 >> 3,0);
      auVar24._12_4_ = (uint)bVar1 * auVar25._12_4_ | (uint)!bVar1 * auVar30._12_4_;
      auVar25 = vphaddd_avx(auVar24,auVar24);
      auVar25 = vphaddd_avx(auVar25,auVar25);
      vcvtdq2pd_avx(auVar25);
    }
    printf("Init average l: %lf\n");
    if (0 < local_25c) {
      lVar22 = 0;
      do {
        pDVar21 = local_1d0 + lVar22;
        lVar20 = 0;
        do {
          (*(code *)**(undefined8 **)__node_gen[lVar20]._M_h)(__node_gen[lVar20]._M_h,pDVar21);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 5);
        lVar22 = lVar22 + 1;
      } while (lVar22 < local_25c);
    }
    plVar12 = *(long **)(local_1d8 + 0x70);
    iVar7 = *(int *)((long)plVar12 + 0xc) * (int)plVar12[1];
    if (0 < iVar7) {
      uVar16 = (ulong)(iVar7 + 3U & 0xfffffffc);
      auVar28 = vpbroadcastq_avx512vl();
      uVar19 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar25 = ZEXT816(0) << 0x40;
      do {
        auVar24 = auVar25;
        auVar29 = vpbroadcastq_avx512vl();
        auVar29 = vpor_avx2(auVar29,auVar2);
        uVar23 = vpcmpuq_avx512vl(auVar29,auVar28,2);
        uVar23 = uVar23 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(*plVar12 + uVar19 * 8));
        auVar25 = vpgatherqd_avx512vl(*(undefined8 *)(uVar16 + 0x40));
        auVar26._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar25._4_4_;
        auVar26._0_4_ = (uint)((byte)uVar23 & 1) * auVar25._0_4_;
        auVar26._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar25._8_4_;
        auVar26._12_4_ = (uint)(byte)(uVar23 >> 3) * auVar25._12_4_;
        auVar25 = vpaddd_avx(auVar26,auVar24);
        uVar19 = uVar19 + 4;
      } while (uVar16 != uVar19);
      auVar25 = vmovdqa32_avx512vl(auVar25);
      bVar1 = (bool)((byte)uVar23 & 1);
      auVar27._0_4_ = (uint)bVar1 * auVar25._0_4_ | (uint)!bVar1 * auVar24._0_4_;
      bVar1 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar1 * auVar25._4_4_ | (uint)!bVar1 * auVar24._4_4_;
      bVar1 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar1 * auVar25._8_4_ | (uint)!bVar1 * auVar24._8_4_;
      bVar1 = SUB81(uVar23 >> 3,0);
      auVar27._12_4_ = (uint)bVar1 * auVar25._12_4_ | (uint)!bVar1 * auVar24._12_4_;
      auVar25 = vphaddd_avx(auVar27,auVar27);
      auVar25 = vphaddd_avx(auVar25,auVar25);
      vcvtdq2pd_avx(auVar25);
    }
    printf("After average l: %lf\n");
    lVar22 = 0;
    do {
      this = (Abstract<4U> *)__node_gen[lVar22]._M_h;
      local_168._M_buckets = (__buckets_ptr)0x0;
      local_168._M_bucket_count = local_1a0._8_8_;
      local_168._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_168._M_element_count = local_190._8_8_;
      local_168._M_rehash_policy._4_4_ = uStack_17c;
      local_168._M_rehash_policy._M_max_load_factor = local_180;
      local_168._M_rehash_policy._M_next_resize = auStack_178._0_8_;
      local_168._M_single_bucket = (__node_base_ptr)0x0;
      local_238._M_h = (__hashtable_alloc *)&local_168;
      std::
      _Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<4u>const,int>,true>>>>
                ((_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_168,
                 (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_1a0,&local_238);
      Abstract<4U>::CheckSubset(this,(HashMap<4U> *)&local_168,local_1dc,100,1000,&local_1f8);
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_168);
      (*this->_vptr_Abstract[9])(this);
      ppbVar5 = local_1f8.
                super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar22 = lVar22 + 1;
      p_Var17 = (__node_base_ptr)
                local_1f8.
                super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar22 != 5);
    for (; p_Var17 != (__node_base_ptr)ppbVar5; p_Var17 = p_Var17 + 1) {
      cVar3 = (char)p_Var17->_M_nxt;
      std::ios::widen((char)p_Var17->_M_nxt->_M_nxt[-3]._M_nxt + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    __node_gen = __node_gen + 5;
  } while (local_1a8 != 5);
  operator_delete(local_1d0,4);
  if ((__node_base_ptr)
      local_1f8.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1a0);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  return;
}

Assistant:

void BenchTopKSubset(std::string PATH)
{
	printf("\033[0m\033[1;4;33m# Testing function: BenchTopKSubset\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 5;
	constexpr int32_t cmp_num = 5;
	constexpr int32_t epoch_num = 100;
	constexpr int32_t batch_size = 1000;
	int heap_size = 2500;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK<DATA_LEN>(mp, 2000);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new SS<DATA_LEN>(memory / 100);
		sketches[i][2] = new USS<DATA_LEN>(memory / 100);
		sketches[i][3] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][4] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE.csv"); // subset sum
	outs[1] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE1.csv"); //subset average
	outs[3] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE1.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->CheckSubset(mp, topK, epoch_num, batch_size, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}